

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O1

uint32_t __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<6>::GetAxis
          (DynamicIntegerPointsKdTreeDecoder<6> *this,uint32_t num_remaining_points,
          VectorUint32 *levels,uint32_t last_axis)

{
  pointer puVar1;
  ulong uVar2;
  uint in_EAX;
  uint uVar3;
  ulong uVar4;
  uint32_t best_axis;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  uVar2 = uStack_8;
  if (num_remaining_points < 0x40) {
    if (1 < (ulong)this->dimension_) {
      uStack_8._4_4_ = 0;
      puVar1 = (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = 1;
      uVar3 = uStack_8._4_4_;
      uStack_8 = uVar2;
      do {
        if (puVar1[uVar4] < puVar1[uVar3]) {
          uVar3 = (uint)uVar4;
          uStack_8 = uVar4 << 0x20;
        }
        uVar4 = uVar4 + 1;
      } while (this->dimension_ != uVar4);
    }
  }
  else {
    DirectBitDecoder::DecodeLeastSignificantBits32
              (&this->axis_decoder_,4,(uint32_t *)((long)&uStack_8 + 4));
  }
  return uStack_8._4_4_;
}

Assistant:

uint32_t DynamicIntegerPointsKdTreeDecoder<compression_level_t>::GetAxis(
    uint32_t num_remaining_points, const VectorUint32 &levels,
    uint32_t last_axis) {
  if (!Policy::select_axis) {
    return DRACO_INCREMENT_MOD(last_axis, dimension_);
  }

  uint32_t best_axis = 0;
  if (num_remaining_points < 64) {
    for (uint32_t axis = 1; axis < dimension_; ++axis) {
      if (levels[best_axis] > levels[axis]) {
        best_axis = axis;
      }
    }
  } else {
    axis_decoder_.DecodeLeastSignificantBits32(4, &best_axis);
  }

  return best_axis;
}